

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteAsmJsUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,uint C1)

{
  bool bVar1;
  undefined1 local_9 [8];
  OpLayoutT_AsmUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) &&
     (local_9[0] = (undefined1)C1, C1 < 0x100)) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,local_9,1,&this->super_ByteCodeWriter
               ,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmJsUnsigned1(OpCodeAsmJs op, uint C1)
    {
        OpLayoutT_AsmUnsigned1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.C1, C1))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }